

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unary_operators.hpp
# Opt level: O1

bool __thiscall
viennamath::op_unary<viennamath::op_sin<double>,_viennamath::rt_expression_interface<double>_>::
equal(op_unary<viennamath::op_sin<double>,_viennamath::rt_expression_interface<double>_> *this,
     op_interface<viennamath::rt_expression_interface<double>_> *other)

{
  long lVar1;
  
  if (other != (op_interface<viennamath::rt_expression_interface<double>_> *)0x0) {
    lVar1 = __dynamic_cast(other,&op_interface<viennamath::rt_expression_interface<double>>::
                                  typeinfo,
                           &op_unary<viennamath::op_sin<double>,viennamath::rt_expression_interface<double>>
                            ::typeinfo,0);
    return lVar1 != 0;
  }
  return false;
}

Assistant:

bool equal(const op_interface<InterfaceType> * other) const
      {
        const op_unary<UnaryOperation, InterfaceType> * ptr = dynamic_cast<const op_unary<UnaryOperation, InterfaceType> *>(other);
        if (ptr != NULL)
          return unary_op_equal(ptr->op(), unary_op_); //needed for partial derivatives

        return false;
      }